

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O1

decNumber * uprv_decNumberPlus_63(decNumber *res,decNumber *rhs,decContext *set)

{
  uint32_t status;
  decNumber dzero;
  uint32_t local_28;
  decNumber local_24;
  
  local_28 = 0;
  local_24.bits = '\0';
  local_24.lsu[0] = '\0';
  local_24.exponent = rhs->exponent;
  local_24.digits = 1;
  decAddOp(res,&local_24,rhs,set,'\0',&local_28);
  if (local_28 != 0) {
    decStatus(res,local_28,set);
  }
  return res;
}

Assistant:

U_CAPI decNumber * U_EXPORT2 uprv_decNumberPlus(decNumber *res, const decNumber *rhs,
                          decContext *set) {
  decNumber dzero;
  uInt status=0;                        /* accumulator  */
  #if DECCHECK
  if (decCheckOperands(res, DECUNUSED, rhs, set)) return res;
  #endif

  uprv_decNumberZero(&dzero);                /* make 0  */
  dzero.exponent=rhs->exponent;         /* [no coefficient expansion]  */
  decAddOp(res, &dzero, rhs, set, 0, &status);
  if (status!=0) decStatus(res, status, set);
  #if DECCHECK
  decCheckInexact(res, set);
  #endif
  return res;
  }